

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucs.h
# Opt level: O2

unsigned_short MeCab::utf8_to_ucs2(char *begin,char *end,size_t *mblen)

{
  byte bVar1;
  ushort uVar2;
  ulong uVar3;
  
  bVar1 = *begin;
  if (-1 < (char)bVar1) {
    *mblen = 1;
    return (unsigned_short)(byte)*begin;
  }
  uVar3 = (long)end - (long)begin;
  if ((bVar1 & 0xe0) != 0xc0 || uVar3 < 2) {
    if (2 < uVar3) {
      if ((bVar1 & 0xf0) == 0xe0) {
        *mblen = 3;
        uVar2 = ((byte)begin[1] & 0x3f) << 6 | (ushort)(byte)*begin << 0xc;
        bVar1 = begin[2];
        goto LAB_001182db;
      }
      if (uVar3 != 3) {
        if ((bVar1 & 0xf8) == 0xf0) {
          *mblen = 4;
          return 0;
        }
        if (4 < uVar3) {
          if ((bVar1 & 0xfc) == 0xf8) {
            *mblen = 5;
            return 0;
          }
          if ((bVar1 & 0xfe) == 0xfc && uVar3 != 5) {
            *mblen = 6;
            return 0;
          }
        }
      }
    }
    *mblen = 1;
    return 0;
  }
  *mblen = 2;
  uVar2 = ((byte)*begin & 0x1f) << 6;
  bVar1 = begin[1];
LAB_001182db:
  return bVar1 & 0x3f | uVar2;
}

Assistant:

inline unsigned short utf8_to_ucs2(const char *begin, const char *end,
                                   size_t*  mblen) {
  const size_t len = end - begin;

  if (static_cast<unsigned char>(begin[0]) < 0x80) {
    *mblen = 1;
    return static_cast<unsigned char>(begin[0]);

  } else if (len >= 2 && (begin[0] & 0xe0) == 0xc0) {
    *mblen = 2;
    return((begin[0] & 0x1f) << 6) |(begin[1] & 0x3f);

  } else if (len >= 3 && (begin[0] & 0xf0) == 0xe0) {
    *mblen = 3;
    return ((begin[0] & 0x0f) << 12) |
        ((begin[1] & 0x3f) << 6) |(begin[2] & 0x3f);

    /* belows are out of UCS2 */
  } else if (len >= 4 && (begin[0] & 0xf8) == 0xf0) {
    *mblen = 4;
    return 0;

  } else if (len >= 5 && (begin[0] & 0xfc) == 0xf8) {
    *mblen = 5;
    return 0;

  } else if (len >= 6 && (begin[0] & 0xfe) == 0xfc) {
    *mblen = 6;
    return 0;

  } else {
    *mblen = 1;
    return 0;
  }
}